

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O3

void test_font_props(wins *wins_ar,int ar_len)

{
  Am_Font_Family_Flag AVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  int max_char_descent;
  int max_char_ascent;
  long local_48;
  Am_Font local_40 [8];
  int min_char_width;
  int max_char_width;
  
  test_string = "Egypt";
  test_str_len = 5;
  bVar5 = false;
  bVar7 = true;
  uVar9 = 0;
  do {
    bVar6 = false;
    uVar8 = 0;
    bVar4 = true;
    do {
      bVar3 = bVar4;
      local_48 = 0;
      do {
        AVar1 = test_font_variety::family_array[local_48];
        uVar10 = 0;
        do {
          Am_Font::Am_Font(local_40,AVar1,bVar5,bVar6,false,test_font_variety::size_array[uVar10]);
          Am_Font::operator=((Am_Font *)&test_font,local_40);
          Am_Font::~Am_Font(local_40);
          if (0 < ar_len) {
            lVar11 = 0;
            do {
              plVar2 = *(long **)((long)&wins_ar->font_win + lVar11);
              (**(code **)(*plVar2 + 0xd8))
                        (plVar2,&test_font,&max_char_width,&min_char_width,&max_char_ascent,
                         &max_char_descent);
              (**(code **)(*plVar2 + 0xd0))
                        (plVar2,&test_font,test_string,test_str_len,&test_string_width,
                         &test_string_ascent,&test_string_descent,&test_string_left_bearing,
                         &test_string_right_bearing);
              test_string_height = test_string_descent + test_string_ascent;
              if ((max_char_ascent < test_string_ascent) || (max_char_descent < test_string_descent)
                 ) {
                printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, size=%d\n",uVar9,
                       (ulong)uVar8,local_48,uVar10 & 0xffffffff);
                exit(-1);
              }
              lVar11 = lVar11 + 0x40;
            } while ((ulong)(uint)ar_len << 6 != lVar11);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != 4);
        local_48 = local_48 + 1;
      } while (local_48 != 3);
      uVar8 = 1;
      bVar6 = true;
      bVar4 = false;
    } while (bVar3);
    uVar9 = 1;
    bVar5 = true;
    bVar4 = !bVar7;
    bVar7 = false;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void
test_font_props(wins *wins_ar, int ar_len)
{
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  test_string = "Egypt";
  test_str_len = 5;
  for (int bold = 0; bold < 2; bold++) {
    for (int ital = 0; ital < 2; ital++) {
      for (int fam = 0; fam < 3; fam++) {
        for (int size = 0; size < 4; size++) {
          int max_char_width, min_char_width, max_char_ascent, max_char_descent;
          test_font =
              Am_Font(family_array[fam], bold, ital, false, size_array[size]);
          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            font_win->Get_Font_Properties(test_font, max_char_width,
                                          min_char_width, max_char_ascent,
                                          max_char_descent);
            update_font_numbers(font_win);
            if ((test_string_ascent > max_char_ascent) ||
                (test_string_descent > max_char_descent)) {
              //(test_string_width   < (test_str_len * min_char_width)) || //under Windows, we get aver. char. width
              //as min. char. width
              //(test_string_width   > (test_str_len * max_char_width)))
              printf("test_font_props() failed:  bold=%d, ital=%d, fam=%d, "
                     "size=%d\n",
                     bold, ital, fam, size);
              exit(-1);
            }
          }
        }
      }
    }
  }
  //  fprintf(stderr, "test_font_props() passed all standard font tests.\n");
}